

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_sort.h
# Opt level: O0

void __thiscall
embree::ParallelRadixSort<embree::parallel_map<unsigned_int,_unsigned_int>::KeyValue,_unsigned_int>
::tbbRadixIteration(ParallelRadixSort<embree::parallel_map<unsigned_int,_unsigned_int>::KeyValue,_unsigned_int>
                    *this,uint shift,bool last,KeyValue *src,KeyValue *dst,size_t numTasks)

{
  bool bVar1;
  runtime_error *prVar2;
  byte in_DL;
  undefined8 in_R9;
  affinity_partitioner ap;
  task_group_context context;
  task_group_context context_1;
  task_group_context *in_stack_fffffffffffffdb8;
  affinity_partitioner *in_stack_fffffffffffffdc0;
  anon_class_8_1_898bcfc2_conflict3 *in_stack_fffffffffffffdc8;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  unsigned_long in_stack_fffffffffffffdd8;
  unsigned_long in_stack_fffffffffffffde0;
  undefined1 local_1f8 [8];
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  undefined8 *local_1d8;
  undefined1 local_1c0 [8];
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  undefined8 *local_1a0;
  undefined1 local_198 [16];
  undefined8 local_188;
  undefined1 local_180 [8];
  undefined1 local_178 [11];
  byte local_16d;
  undefined1 local_16c [28];
  undefined1 *local_150;
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined1 *local_a0;
  undefined1 *local_18;
  undefined1 *local_10;
  undefined8 local_8;
  
  local_16d = in_DL & 1;
  local_188 = in_R9;
  tbb::detail::d1::affinity_partitioner::affinity_partitioner((affinity_partitioner *)0x1e9aa8);
  local_1b8 = local_16c;
  local_1b0 = local_178;
  local_1a8 = local_180;
  local_1a0 = &local_188;
  local_b8 = local_188;
  local_c0 = local_1c0;
  local_c8 = local_198;
  tbb::detail::d1::task_group_context::task_group_context
            ((task_group_context *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
             (kind_type)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
             (uintptr_t)in_stack_fffffffffffffdc0);
  local_150 = local_c0;
  tbb::detail::d1::
  parallel_for<unsigned_long,embree::parallel_for_affinity<unsigned_long,embree::ParallelRadixSort<embree::parallel_map<unsigned_int,unsigned_int>::KeyValue,unsigned_int>::tbbRadixIteration(unsigned_int,bool,embree::parallel_map<unsigned_int,unsigned_int>::KeyValue_const*,embree::parallel_map<unsigned_int,unsigned_int>::KeyValue*,unsigned_long)::_lambda(unsigned_long)_1_>(unsigned_long,embree::ParallelRadixSort<embree::parallel_map<unsigned_int,unsigned_int>::KeyValue,unsigned_int>::tbbRadixIteration(unsigned_int,bool,embree::parallel_map<unsigned_int,unsigned_int>::KeyValue_const*,embree::parallel_map<unsigned_int,unsigned_int>::KeyValue*,unsigned_long)::_lambda(unsigned_long)_1_const&,tbb::detail::d1::affinity_partitioner&)::_lambda(unsigned_long)_1_>
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
             CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),in_stack_fffffffffffffdc8
             ,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  bVar1 = tbb::detail::d1::task_group_context::is_group_execution_cancelled
                    ((task_group_context *)0x1e9b87);
  if (bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"task cancelled");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)0x1e9c42);
  local_1f0 = local_16c;
  local_1e8 = local_178;
  local_1e0 = local_180;
  local_1d8 = &local_188;
  local_8 = local_188;
  local_10 = local_1f8;
  local_18 = local_198;
  tbb::detail::d1::task_group_context::task_group_context
            ((task_group_context *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
             (kind_type)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
             (uintptr_t)in_stack_fffffffffffffdc0);
  local_a0 = local_10;
  tbb::detail::d1::
  parallel_for<unsigned_long,embree::parallel_for_affinity<unsigned_long,embree::ParallelRadixSort<embree::parallel_map<unsigned_int,unsigned_int>::KeyValue,unsigned_int>::tbbRadixIteration(unsigned_int,bool,embree::parallel_map<unsigned_int,unsigned_int>::KeyValue_const*,embree::parallel_map<unsigned_int,unsigned_int>::KeyValue*,unsigned_long)::_lambda(unsigned_long)_2_>(unsigned_long,embree::ParallelRadixSort<embree::parallel_map<unsigned_int,unsigned_int>::KeyValue,unsigned_int>::tbbRadixIteration(unsigned_int,bool,embree::parallel_map<unsigned_int,unsigned_int>::KeyValue_const*,embree::parallel_map<unsigned_int,unsigned_int>::KeyValue*,unsigned_long)::_lambda(unsigned_long)_2_const&,tbb::detail::d1::affinity_partitioner&)::_lambda(unsigned_long)_1_>
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
             CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),in_stack_fffffffffffffdc8
             ,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  bVar1 = tbb::detail::d1::task_group_context::is_group_execution_cancelled
                    ((task_group_context *)0x1e9d12);
  if (!bVar1) {
    tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)0x1e9dc9);
    tbb::detail::d1::affinity_partitioner::~affinity_partitioner((affinity_partitioner *)0x1e9dd6);
    return;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,"task cancelled");
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void tbbRadixIteration(const Key shift, const bool last,
                           const Ty* __restrict src, Ty* __restrict dst,
                           const size_t numTasks)
    {
      affinity_partitioner ap;
      parallel_for_affinity(numTasks,[&] (size_t taskIndex) { tbbRadixIteration0(shift,src,dst,taskIndex,numTasks); },ap);
      parallel_for_affinity(numTasks,[&] (size_t taskIndex) { tbbRadixIteration1(shift,src,dst,taskIndex,numTasks); },ap);
    }